

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

TypeID NULLCTypeInfo::GetType(NULLCArray name)

{
  uint uVar1;
  ExternTypeInfo *pEVar2;
  uint uVar3;
  uint i;
  uint index;
  
  if (name.ptr == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar1 = NULLC::GetStringHash(name.ptr);
    index = 0;
    while ((uVar3 = 0, index < *(uint *)(linker + 0x20c) &&
           (pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                               ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),index),
           uVar3 = index, pEVar2->nameHash != uVar1))) {
      index = index + 1;
    }
  }
  return (TypeID)uVar3;
}

Assistant:

TypeID GetType(NULLCArray name)
	{
		if(!name.ptr)
			return getTypeID(0);

		unsigned hash = NULLC::GetStringHash(name.ptr);

		for(unsigned i = 0; i < linker->exTypes.size(); i++)
		{
			if(linker->exTypes[i].nameHash == hash)
				return getTypeID(i);
		}
		return getTypeID(0);
	}